

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

int __thiscall Map<String,_int>::remove(Map<String,_int> *this,char *__filename)

{
  Item *this_00;
  Item *pIVar1;
  usize uVar2;
  usize uVar3;
  code *pcVar4;
  int iVar5;
  Item *pIVar6;
  Item *pIVar7;
  Item *pIVar8;
  undefined8 uVar9;
  Iterator *pIVar10;
  Item *pIVar11;
  Item **ppIVar12;
  Item *pIVar13;
  
  this_00 = *(Item **)__filename;
  pIVar6 = this_00->parent;
  if (pIVar6 == (Item *)0x0) {
    ppIVar12 = &this->root;
  }
  else {
    ppIVar12 = &pIVar6->right;
    if (this_00 == pIVar6->left) {
      ppIVar12 = &pIVar6->left;
    }
  }
  if ((*ppIVar12 != this_00) &&
     (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                            ,0xc9,"*cell == item"), iVar5 != 0)) goto LAB_001048fc;
  pIVar7 = this_00->left;
  pIVar11 = this_00->right;
  pIVar13 = pIVar6;
  if (pIVar7 == (Item *)0x0 && pIVar11 == (Item *)0x0) {
    *ppIVar12 = (Item *)0x0;
    goto LAB_001046b6;
  }
  if (pIVar7 == (Item *)0x0) {
    *ppIVar12 = pIVar11;
    pIVar11->parent = pIVar6;
    goto LAB_001046b6;
  }
  if (pIVar11 == (Item *)0x0) {
    *ppIVar12 = pIVar7;
    pIVar7->parent = pIVar6;
    goto LAB_001046b6;
  }
  if (pIVar7->height < pIVar11->height) {
    pIVar8 = this_00->next;
    if ((pIVar8->left != (Item *)0x0) &&
       (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0xe4,"!next->left"), iVar5 != 0)) goto LAB_001048fc;
    pIVar13 = pIVar8->parent;
    if (pIVar13 == this_00) {
      if ((pIVar8 != pIVar11) &&
         (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0xe8,"next == right"), iVar5 != 0)) goto LAB_001048fc;
      *ppIVar12 = pIVar8;
      pIVar8->parent = pIVar6;
      pIVar8->left = pIVar7;
      pIVar11 = pIVar7;
LAB_0010487b:
      pIVar11->parent = pIVar8;
      pIVar13 = pIVar8;
    }
    else {
      if ((pIVar8 != pIVar13->left) &&
         (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0xf3,"next == nextParent->left"), iVar5 != 0)) goto LAB_001048fc;
      pIVar1 = pIVar8->right;
      pIVar13->left = pIVar1;
      if (pIVar1 != (Item *)0x0) {
        pIVar1->parent = pIVar13;
      }
      *ppIVar12 = pIVar8;
      pIVar8->parent = pIVar6;
      pIVar8->left = pIVar7;
      pIVar7->parent = pIVar8;
      pIVar8->right = pIVar11;
      pIVar11->parent = pIVar8;
      if (pIVar13 == (Item *)0x0) {
        uVar9 = 0x107;
LAB_001048a4:
        iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,uVar9,"parent");
        if (iVar5 != 0) {
LAB_001048fc:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
      }
    }
  }
  else {
    pIVar8 = this_00->prev;
    if ((pIVar8->right != (Item *)0x0) &&
       (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x10d,"!prev->right"), iVar5 != 0)) goto LAB_001048fc;
    pIVar13 = pIVar8->parent;
    if (pIVar13 == this_00) {
      if ((pIVar8 != pIVar7) &&
         (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x111,"prev == left"), iVar5 != 0)) goto LAB_001048fc;
      *ppIVar12 = pIVar8;
      pIVar8->parent = pIVar6;
      pIVar8->right = pIVar11;
      goto LAB_0010487b;
    }
    if ((pIVar8 != pIVar13->right) &&
       (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x11c,"prev == prevParent->right"), iVar5 != 0)) goto LAB_001048fc;
    pIVar1 = pIVar8->left;
    pIVar13->right = pIVar1;
    if (pIVar1 != (Item *)0x0) {
      pIVar1->parent = pIVar13;
    }
    *ppIVar12 = pIVar8;
    pIVar8->parent = pIVar6;
    pIVar8->right = pIVar11;
    pIVar11->parent = pIVar8;
    pIVar8->left = pIVar7;
    pIVar7->parent = pIVar8;
    if (pIVar13 == (Item *)0x0) {
      uVar9 = 0x130;
      goto LAB_001048a4;
    }
  }
  do {
    uVar2 = pIVar13->height;
    Item::updateHeightAndSlope(pIVar13);
    pIVar7 = rebal(this,pIVar13);
    uVar3 = pIVar7->height;
    if (uVar2 == uVar3) {
      pIVar7 = *ppIVar12;
      Item::updateHeightAndSlope(pIVar7);
      pIVar7 = rebal(this,pIVar7);
    }
    pIVar13 = pIVar7->parent;
  } while ((uVar2 != uVar3) && (pIVar13 != pIVar6));
LAB_001046b6:
  while (pIVar13 != (Item *)0x0) {
    uVar2 = pIVar13->height;
    Item::updateHeightAndSlope(pIVar13);
    pIVar6 = rebal(this,pIVar13);
    if (uVar2 == pIVar6->height) break;
    pIVar13 = pIVar6->parent;
  }
  pIVar6 = this_00->next;
  pIVar7 = this_00->prev;
  pIVar10 = (Iterator *)&pIVar7->next;
  if (pIVar7 == (Item *)0x0) {
    pIVar10 = &this->_begin;
  }
  pIVar10->item = pIVar6;
  pIVar6->prev = pIVar7;
  this->_size = this->_size - 1;
  String::~String(&this_00->key);
  this_00->prev = this->freeItem;
  this->freeItem = this_00;
  return (int)this_00->next;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;
    Item* origParent;
    Item* parent = origParent = item->parent;
    Item** cell = parent ? (item == parent->left ? &parent->left : &parent->right) : &root;
    ASSERT(*cell == item);
    Item* left = item->left;
    Item* right = item->right;

    if(!left && !right)
    {
      *cell = 0;
      goto rebalParentUpwards;
    }

    if(!left)
    {
      *cell = right;
      right->parent = parent;
      goto rebalParentUpwards;
    }

    if(!right)
    {
      *cell = left;
      left->parent = parent;
      goto rebalParentUpwards;
    }

    if(left->height < right->height)
    {
      Item* next = item->next;
      ASSERT(!next->left);
      Item* nextParent = next->parent;
      if(nextParent == item)
      {
        ASSERT(next == right);
        *cell = next;
        next->parent = parent;

        next->left = left;
        left->parent = next;
        parent = next;
        goto rebalParent;
      }

      // unlink next
      ASSERT(next == nextParent->left);
      Item* nextRight = next->right;
      nextParent->left = nextRight;
      if(nextRight)
        nextRight->parent = nextParent;
      
      // put next in cell
      *cell = next;
      next->parent = parent;

      // link left to next left
      next->left = left;
      left->parent = next;

      // link right to next right
      next->right = right;
      right->parent = next;

      // rebal old next->parent
      parent = nextParent;
      ASSERT(parent);
      goto rebalParent;
    }
    else
    {
      Item* prev = item->prev;
      ASSERT(!prev->right);
      Item* prevParent = prev->parent;
      if(prevParent == item)
      {
        ASSERT(prev == left);
        *cell = prev;
        prev->parent = parent;

        prev->right = right;
        right->parent = prev;
        parent = prev;
        goto rebalParent;
      }

      // unlink prev
      ASSERT(prev == prevParent->right);
      Item* prevLeft = prev->left;
      prevParent->right = prevLeft;
      if(prevLeft)
        prevLeft->parent = prevParent;

      // put prev in cell
      *cell = prev;
      prev->parent = parent;

      // link right to prev right
      prev->right = right;
      right->parent = prev;

      // link left to prev left
      prev->left = left;
      left->parent = prev;

      // rebal old prev->parent
      parent = prevParent;
      ASSERT(parent);
      goto rebalParent;
    }

    // rebal parent upwards
  rebalParent:
    do
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
      {
        parent = *cell;
        parent->updateHeightAndSlope();
        parent = rebal(parent);
        parent = parent->parent;
        break;
      }
      parent = parent->parent;
    } while(parent != origParent);
  rebalParentUpwards:
    while(parent)
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
        break;
      parent = parent->parent;
    }

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;
    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }